

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::unlink_lower(HighsNodeQueue *this,int64_t node)

{
  char *in_RSI;
  NodeLowerRbTree rbTree;
  RbTree<HighsNodeQueue::NodeLowerRbTree> in_stack_ffffffffffffffd8;
  NodeLowerRbTree *in_stack_ffffffffffffffe0;
  
  NodeLowerRbTree::NodeLowerRbTree
            (in_stack_ffffffffffffffe0,(HighsNodeQueue *)in_stack_ffffffffffffffd8.rootNode);
  ::highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::unlink
            ((CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> *)&stack0xffffffffffffffd8,in_RSI);
  return;
}

Assistant:

void HighsNodeQueue::unlink_lower(int64_t node) {
  assert(node != -1);
  NodeLowerRbTree rbTree(this);
  rbTree.unlink(node);
}